

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  int iVar8;
  undefined4 uVar9;
  undefined1 (*pauVar10) [16];
  long lVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  uint uVar62;
  uint uVar63;
  uint uVar64;
  undefined1 auVar61 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2760 [16];
  Scene *local_2748;
  undefined1 local_2740 [16];
  Geometry *local_2730;
  ulong local_2728;
  long local_2720;
  long local_2718;
  ulong local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [16];
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2630 [16];
  float local_2620 [4];
  float local_2610 [4];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar39 [32];
  undefined1 auVar42 [32];
  
  pauVar10 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar79 = ZEXT3264(CONCAT428(fVar47,CONCAT424(fVar47,CONCAT420(fVar47,CONCAT416(fVar47,CONCAT412(
                                                  fVar47,CONCAT48(fVar47,CONCAT44(fVar47,fVar47)))))
                                               )));
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_24e0._4_4_ = fVar52;
  local_24e0._0_4_ = fVar52;
  local_24e0._8_4_ = fVar52;
  local_24e0._12_4_ = fVar52;
  local_24e0._16_4_ = fVar52;
  local_24e0._20_4_ = fVar52;
  local_24e0._24_4_ = fVar52;
  local_24e0._28_4_ = fVar52;
  auVar46 = ZEXT3264(local_24e0);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2500._4_4_ = fVar53;
  local_2500._0_4_ = fVar53;
  local_2500._8_4_ = fVar53;
  local_2500._12_4_ = fVar53;
  local_2500._16_4_ = fVar53;
  local_2500._20_4_ = fVar53;
  local_2500._24_4_ = fVar53;
  local_2500._28_4_ = fVar53;
  auVar51 = ZEXT3264(local_2500);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar52 = fVar52 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar53 = fVar53 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2708 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_2710 = uVar21 ^ 0x20;
  uVar25 = local_2708 ^ 0x20;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar28 = ZEXT3264(CONCAT428(iVar8,CONCAT424(iVar8,CONCAT420(iVar8,CONCAT416(iVar8,CONCAT412(iVar8
                                                  ,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))))))));
  local_2520._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_2520._8_4_ = -fVar47;
  local_2520._12_4_ = -fVar47;
  local_2520._16_4_ = -fVar47;
  local_2520._20_4_ = -fVar47;
  local_2520._24_4_ = -fVar47;
  local_2520._28_4_ = -fVar47;
  auVar57 = ZEXT3264(local_2520);
  local_2540._0_8_ = CONCAT44(fVar52,fVar52) ^ 0x8000000080000000;
  local_2540._8_4_ = -fVar52;
  local_2540._12_4_ = -fVar52;
  local_2540._16_4_ = -fVar52;
  local_2540._20_4_ = -fVar52;
  local_2540._24_4_ = -fVar52;
  local_2540._28_4_ = -fVar52;
  auVar61 = ZEXT3264(local_2540);
  iVar8 = (tray->tnear).field_0.i[k];
  local_2560._4_4_ = iVar8;
  local_2560._0_4_ = iVar8;
  local_2560._8_4_ = iVar8;
  local_2560._12_4_ = iVar8;
  local_2560._16_4_ = iVar8;
  local_2560._20_4_ = iVar8;
  local_2560._24_4_ = iVar8;
  local_2560._28_4_ = iVar8;
  auVar66 = ZEXT3264(local_2560);
  local_2580._0_8_ = CONCAT44(fVar53,fVar53) ^ 0x8000000080000000;
  local_2580._8_4_ = -fVar53;
  local_2580._12_4_ = -fVar53;
  local_2580._16_4_ = -fVar53;
  local_2580._20_4_ = -fVar53;
  local_2580._24_4_ = -fVar53;
  local_2580._28_4_ = -fVar53;
  auVar70 = ZEXT3264(local_2580);
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar35._4_4_ = iVar8;
  auVar35._0_4_ = iVar8;
  auVar35._8_4_ = iVar8;
  auVar35._12_4_ = iVar8;
  auVar35._16_4_ = iVar8;
  auVar35._20_4_ = iVar8;
  auVar35._24_4_ = iVar8;
  auVar35._28_4_ = iVar8;
  auVar39 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar35 = vpand_avx2(auVar35,auVar39);
  local_25a0 = vpcmpeqd_avx2(auVar35,auVar39);
LAB_0061dbe9:
  do {
    pauVar24 = pauVar10 + -1;
    pauVar10 = pauVar10 + -1;
    if (*(float *)(*pauVar24 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar16 = *(ulong *)*pauVar10;
      while ((uVar16 & 8) == 0) {
        auVar56 = auVar57._0_32_;
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar21),auVar56,
                                  auVar79._0_32_);
        auVar42 = auVar46._0_32_;
        auVar60 = auVar61._0_32_;
        auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + local_2708),auVar60,auVar42
                                 );
        auVar35 = vpmaxsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar36));
        auVar50 = auVar51._0_32_;
        auVar69 = auVar70._0_32_;
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar23),auVar69,auVar50);
        auVar39 = vpmaxsd_avx2(ZEXT1632(auVar29),auVar66._0_32_);
        local_24c0 = vpmaxsd_avx2(auVar35,auVar39);
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + local_2710),auVar56,
                                  auVar79._0_32_);
        auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar25),auVar60,auVar42);
        auVar35 = vpminsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar36));
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar23 ^ 0x20)),auVar69,
                                  auVar50);
        auVar39 = vpminsd_avx2(ZEXT1632(auVar29),auVar28._0_32_);
        auVar35 = vpminsd_avx2(auVar35,auVar39);
        auVar35 = vpcmpgtd_avx2(local_24c0,auVar35);
        iVar8 = vmovmskps_avx(auVar35);
        if (iVar8 == 0xff) {
          if (pauVar10 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_0061dbe9;
        }
        bVar12 = ~(byte)iVar8;
        uVar22 = uVar16 & 0xfffffffffffffff0;
        lVar11 = 0;
        for (uVar16 = (ulong)bVar12; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar16 = *(ulong *)(uVar22 + lVar11 * 8);
        uVar13 = bVar12 - 1 & (uint)bVar12;
        uVar14 = (ulong)uVar13;
        if (uVar13 != 0) {
          uVar62 = *(uint *)(local_24c0 + lVar11 * 4);
          lVar11 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar20 = (ulong)uVar13;
          uVar14 = *(ulong *)(uVar22 + lVar11 * 8);
          uVar63 = *(uint *)(local_24c0 + lVar11 * 4);
          if (uVar13 == 0) {
            if (uVar62 < uVar63) {
              *(ulong *)*pauVar10 = uVar14;
              *(uint *)(*pauVar10 + 8) = uVar63;
              pauVar10 = pauVar10 + 1;
            }
            else {
              *(ulong *)*pauVar10 = uVar16;
              *(uint *)(*pauVar10 + 8) = uVar62;
              pauVar10 = pauVar10 + 1;
              uVar16 = uVar14;
            }
          }
          else {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar16;
            auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar62));
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar14;
            auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar63));
            lVar11 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar16 = (ulong)uVar13;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)(uVar22 + lVar11 * 8);
            auVar30 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_24c0 + lVar11 * 4)));
            auVar40 = vpcmpgtd_avx(auVar36,auVar29);
            if (uVar13 == 0) {
              auVar43 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar36,auVar29,auVar43);
              auVar29 = vblendvps_avx(auVar29,auVar36,auVar43);
              auVar36 = vpcmpgtd_avx(auVar30,auVar40);
              auVar43 = vpshufd_avx(auVar36,0xaa);
              auVar36 = vblendvps_avx(auVar30,auVar40,auVar43);
              auVar40 = vblendvps_avx(auVar40,auVar30,auVar43);
              auVar30 = vpcmpgtd_avx(auVar40,auVar29);
              auVar43 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar40,auVar29,auVar43);
              auVar29 = vblendvps_avx(auVar29,auVar40,auVar43);
              *pauVar10 = auVar29;
              pauVar10[1] = auVar30;
              uVar16 = auVar36._0_8_;
              pauVar10 = pauVar10 + 2;
            }
            else {
              lVar11 = 0;
              for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              uVar13 = uVar13 - 1 & uVar13;
              uVar14 = (ulong)uVar13;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(uVar22 + lVar11 * 8);
              auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_24c0 + lVar11 * 4)));
              if (uVar13 == 0) {
                auVar49 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar36,auVar29,auVar49);
                auVar29 = vblendvps_avx(auVar29,auVar36,auVar49);
                auVar36 = vpcmpgtd_avx(auVar43,auVar30);
                auVar49 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar43,auVar30,auVar49);
                auVar30 = vblendvps_avx(auVar30,auVar43,auVar49);
                auVar43 = vpcmpgtd_avx(auVar30,auVar29);
                auVar49 = vpshufd_avx(auVar43,0xaa);
                auVar43 = vblendvps_avx(auVar30,auVar29,auVar49);
                auVar29 = vblendvps_avx(auVar29,auVar30,auVar49);
                auVar30 = vpcmpgtd_avx(auVar36,auVar40);
                auVar49 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar36,auVar40,auVar49);
                auVar36 = vblendvps_avx(auVar40,auVar36,auVar49);
                auVar40 = vpcmpgtd_avx(auVar43,auVar36);
                auVar49 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar43,auVar36,auVar49);
                auVar36 = vblendvps_avx(auVar36,auVar43,auVar49);
                *pauVar10 = auVar29;
                pauVar10[1] = auVar36;
                pauVar10[2] = auVar40;
                uVar16 = auVar30._0_8_;
                pauVar24 = pauVar10 + 3;
              }
              else {
                *pauVar10 = auVar29;
                pauVar10[1] = auVar36;
                pauVar10[2] = auVar30;
                pauVar10[3] = auVar43;
                lVar11 = 0x30;
                do {
                  lVar17 = lVar11;
                  lVar11 = 0;
                  for (uVar16 = uVar14; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000
                      ) {
                    lVar11 = lVar11 + 1;
                  }
                  uVar16 = *(ulong *)(uVar22 + lVar11 * 8);
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = uVar16;
                  auVar29 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_24c0 + lVar11 * 4)));
                  *(undefined1 (*) [16])(pauVar10[1] + lVar17) = auVar29;
                  uVar14 = uVar14 - 1 & uVar14;
                  lVar11 = lVar17 + 0x10;
                } while (uVar14 != 0);
                pauVar24 = (undefined1 (*) [16])(pauVar10[1] + lVar17);
                if (lVar17 + 0x10 != 0) {
                  lVar11 = 0x10;
                  pauVar15 = pauVar10;
                  do {
                    auVar29 = pauVar15[1];
                    pauVar15 = pauVar15 + 1;
                    uVar13 = vextractps_avx(auVar29,2);
                    lVar17 = lVar11;
                    do {
                      if (uVar13 <= *(uint *)(pauVar10[-1] + lVar17 + 8)) {
                        pauVar18 = (undefined1 (*) [16])(*pauVar10 + lVar17);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar10 + lVar17) =
                           *(undefined1 (*) [16])(pauVar10[-1] + lVar17);
                      lVar17 = lVar17 + -0x10;
                      pauVar18 = pauVar10;
                    } while (lVar17 != 0);
                    *pauVar18 = auVar29;
                    lVar11 = lVar11 + 0x10;
                  } while (pauVar24 != pauVar15);
                  uVar16 = *(ulong *)*pauVar24;
                }
              }
              auVar46 = ZEXT3264(auVar42);
              auVar51 = ZEXT3264(auVar50);
              auVar57 = ZEXT3264(auVar56);
              auVar61 = ZEXT3264(auVar60);
              auVar66 = ZEXT3264(auVar66._0_32_);
              auVar70 = ZEXT3264(auVar69);
              pauVar10 = pauVar24;
            }
          }
        }
      }
      local_2718 = (ulong)((uint)uVar16 & 0xf) - 8;
      if (local_2718 != 0) {
        uVar16 = uVar16 & 0xfffffffffffffff0;
        local_2720 = 0;
        do {
          lVar11 = local_2720 * 0x50;
          pSVar19 = context->scene;
          ppfVar2 = (pSVar19->vertices).items;
          pfVar3 = ppfVar2[*(uint *)(uVar16 + 0x30 + lVar11)];
          pfVar4 = ppfVar2[*(uint *)(uVar16 + 0x34 + lVar11)];
          pfVar5 = ppfVar2[*(uint *)(uVar16 + 0x38 + lVar11)];
          pfVar6 = ppfVar2[*(uint *)(uVar16 + 0x3c + lVar11)];
          auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + lVar11)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar16 + 8 + lVar11)));
          auVar29 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + lVar11)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar16 + 8 + lVar11)));
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 4 + lVar11)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar16 + 0xc + lVar11)))
          ;
          auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 4 + lVar11)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar16 + 0xc + lVar11)))
          ;
          auVar32 = vunpcklps_avx(auVar29,auVar36);
          auVar37 = vunpcklps_avx(auVar40,auVar30);
          auVar45 = vunpckhps_avx(auVar40,auVar30);
          auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + 0x10 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar16 + 0x18 + lVar11)));
          auVar29 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + 0x10 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar16 + 0x18 + lVar11)));
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 0x14 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar16 + 0x1c + lVar11)));
          auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 0x14 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar16 + 0x1c + lVar11)));
          auVar49 = vunpcklps_avx(auVar29,auVar36);
          auVar26 = vunpcklps_avx(auVar40,auVar30);
          auVar29 = vunpckhps_avx(auVar40,auVar30);
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + 0x20 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar16 + 0x28 + lVar11)));
          auVar36 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar16 + 0x20 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar16 + 0x28 + lVar11)));
          auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 0x24 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar16 + 0x2c + lVar11)));
          auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar16 + 0x24 + lVar11))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar16 + 0x2c + lVar11)));
          auVar31 = vunpcklps_avx(auVar36,auVar40);
          auVar48 = vunpcklps_avx(auVar30,auVar43);
          auVar43 = vunpckhps_avx(auVar30,auVar43);
          puVar1 = (undefined8 *)(uVar16 + 0x30 + lVar11);
          local_2690 = *puVar1;
          uStack_2688 = puVar1[1];
          puVar1 = (undefined8 *)(uVar16 + 0x40 + lVar11);
          local_26d0 = *puVar1;
          uStack_26c8 = puVar1[1];
          auVar36 = vsubps_avx(auVar37,auVar26);
          auVar29 = vsubps_avx(auVar45,auVar29);
          auVar40 = vsubps_avx(auVar32,auVar49);
          auVar30 = vsubps_avx(auVar48,auVar37);
          auVar43 = vsubps_avx(auVar43,auVar45);
          auVar49 = vsubps_avx(auVar31,auVar32);
          auVar26._0_4_ = auVar49._0_4_ * auVar29._0_4_;
          auVar26._4_4_ = auVar49._4_4_ * auVar29._4_4_;
          auVar26._8_4_ = auVar49._8_4_ * auVar29._8_4_;
          auVar26._12_4_ = auVar49._12_4_ * auVar29._12_4_;
          local_25f0 = vfmsub231ps_fma(auVar26,auVar43,auVar40);
          auVar31._0_4_ = auVar40._0_4_ * auVar30._0_4_;
          auVar31._4_4_ = auVar40._4_4_ * auVar30._4_4_;
          auVar31._8_4_ = auVar40._8_4_ * auVar30._8_4_;
          auVar31._12_4_ = auVar40._12_4_ * auVar30._12_4_;
          local_25e0 = vfmsub231ps_fma(auVar31,auVar49,auVar36);
          uVar9 = *(undefined4 *)(ray + k * 4);
          auVar71._4_4_ = uVar9;
          auVar71._0_4_ = uVar9;
          auVar71._8_4_ = uVar9;
          auVar71._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar73._4_4_ = uVar9;
          auVar73._0_4_ = uVar9;
          auVar73._8_4_ = uVar9;
          auVar73._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar76._4_4_ = uVar9;
          auVar76._0_4_ = uVar9;
          auVar76._8_4_ = uVar9;
          auVar76._12_4_ = uVar9;
          fVar47 = *(float *)(ray + k * 4 + 0x80);
          auVar65._4_4_ = fVar47;
          auVar65._0_4_ = fVar47;
          auVar65._8_4_ = fVar47;
          auVar65._12_4_ = fVar47;
          auVar37 = vsubps_avx(auVar37,auVar71);
          fVar52 = *(float *)(ray + k * 4 + 0xa0);
          auVar72._4_4_ = fVar52;
          auVar72._0_4_ = fVar52;
          auVar72._8_4_ = fVar52;
          auVar72._12_4_ = fVar52;
          auVar45 = vsubps_avx(auVar45,auVar73);
          fVar53 = *(float *)(ray + k * 4 + 0xc0);
          auVar74._4_4_ = fVar53;
          auVar74._0_4_ = fVar53;
          auVar74._8_4_ = fVar53;
          auVar74._12_4_ = fVar53;
          auVar32 = vsubps_avx(auVar32,auVar76);
          auVar77._0_4_ = fVar47 * auVar45._0_4_;
          auVar77._4_4_ = fVar47 * auVar45._4_4_;
          auVar77._8_4_ = fVar47 * auVar45._8_4_;
          auVar77._12_4_ = fVar47 * auVar45._12_4_;
          auVar26 = vfmsub231ps_fma(auVar77,auVar37,auVar72);
          auVar67._0_4_ = auVar49._0_4_ * auVar26._0_4_;
          auVar67._4_4_ = auVar49._4_4_ * auVar26._4_4_;
          auVar67._8_4_ = auVar49._8_4_ * auVar26._8_4_;
          auVar67._12_4_ = auVar49._12_4_ * auVar26._12_4_;
          auVar78._0_4_ = auVar40._0_4_ * auVar26._0_4_;
          auVar78._4_4_ = auVar40._4_4_ * auVar26._4_4_;
          auVar78._8_4_ = auVar40._8_4_ * auVar26._8_4_;
          auVar78._12_4_ = auVar40._12_4_ * auVar26._12_4_;
          auVar58._0_4_ = fVar53 * auVar37._0_4_;
          auVar58._4_4_ = fVar53 * auVar37._4_4_;
          auVar58._8_4_ = fVar53 * auVar37._8_4_;
          auVar58._12_4_ = fVar53 * auVar37._12_4_;
          auVar49 = vfmsub231ps_fma(auVar58,auVar32,auVar65);
          auVar40 = vfmadd231ps_fma(auVar67,auVar49,auVar43);
          auVar49 = vfmadd231ps_fma(auVar78,auVar29,auVar49);
          auVar55._0_4_ = auVar43._0_4_ * auVar36._0_4_;
          auVar55._4_4_ = auVar43._4_4_ * auVar36._4_4_;
          auVar55._8_4_ = auVar43._8_4_ * auVar36._8_4_;
          auVar55._12_4_ = auVar43._12_4_ * auVar36._12_4_;
          local_25d0 = vfmsub231ps_fma(auVar55,auVar30,auVar29);
          auVar48._0_4_ = fVar52 * auVar32._0_4_;
          auVar48._4_4_ = fVar52 * auVar32._4_4_;
          auVar48._8_4_ = fVar52 * auVar32._8_4_;
          auVar48._12_4_ = fVar52 * auVar32._12_4_;
          auVar26 = vfmsub231ps_fma(auVar48,auVar45,auVar74);
          auVar75._0_4_ = local_25d0._0_4_ * fVar53;
          auVar75._4_4_ = local_25d0._4_4_ * fVar53;
          auVar75._8_4_ = local_25d0._8_4_ * fVar53;
          auVar75._12_4_ = local_25d0._12_4_ * fVar53;
          auVar29 = vfmadd231ps_fma(auVar75,local_25e0,auVar72);
          auVar43 = vfmadd231ps_fma(auVar29,local_25f0,auVar65);
          auVar59._8_4_ = 0x80000000;
          auVar59._0_8_ = 0x8000000080000000;
          auVar59._12_4_ = 0x80000000;
          auVar40 = vfmadd231ps_fma(auVar40,auVar26,auVar30);
          auVar29 = vandps_avx(auVar43,auVar59);
          uVar13 = auVar29._0_4_;
          local_2680._0_4_ = (float)(uVar13 ^ auVar40._0_4_);
          uVar62 = auVar29._4_4_;
          local_2680._4_4_ = (float)(uVar62 ^ auVar40._4_4_);
          uVar63 = auVar29._8_4_;
          local_2680._8_4_ = (float)(uVar63 ^ auVar40._8_4_);
          uVar64 = auVar29._12_4_;
          local_2680._12_4_ = (float)(uVar64 ^ auVar40._12_4_);
          auVar29 = vfmadd231ps_fma(auVar49,auVar36,auVar26);
          local_2670._0_4_ = (float)(uVar13 ^ auVar29._0_4_);
          local_2670._4_4_ = (float)(uVar62 ^ auVar29._4_4_);
          local_2670._8_4_ = (float)(uVar63 ^ auVar29._8_4_);
          local_2670._12_4_ = (float)(uVar64 ^ auVar29._12_4_);
          auVar40 = ZEXT816(0) << 0x20;
          auVar29 = vcmpps_avx(local_2680,auVar40,5);
          auVar36 = vcmpps_avx(local_2670,auVar40,5);
          auVar29 = vandps_avx(auVar36,auVar29);
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          local_2650 = vandps_avx(auVar43,auVar49);
          auVar36 = vcmpps_avx(auVar43,auVar40,4);
          auVar29 = vandps_avx(auVar29,auVar36);
          auVar68._0_4_ = local_2680._0_4_ + local_2670._0_4_;
          auVar68._4_4_ = local_2680._4_4_ + local_2670._4_4_;
          auVar68._8_4_ = local_2680._8_4_ + local_2670._8_4_;
          auVar68._12_4_ = local_2680._12_4_ + local_2670._12_4_;
          auVar36 = vcmpps_avx(auVar68,local_2650,2);
          auVar40 = auVar36 & auVar29;
          if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar40[0xf] < '\0') {
            auVar29 = vandps_avx(auVar29,auVar36);
            auVar44._0_4_ = local_25d0._0_4_ * auVar32._0_4_;
            auVar44._4_4_ = local_25d0._4_4_ * auVar32._4_4_;
            auVar44._8_4_ = local_25d0._8_4_ * auVar32._8_4_;
            auVar44._12_4_ = local_25d0._12_4_ * auVar32._12_4_;
            auVar36 = vfmadd213ps_fma(auVar45,local_25e0,auVar44);
            auVar36 = vfmadd213ps_fma(auVar37,local_25f0,auVar36);
            local_2660._0_4_ = (float)(uVar13 ^ auVar36._0_4_);
            local_2660._4_4_ = (float)(uVar62 ^ auVar36._4_4_);
            local_2660._8_4_ = (float)(uVar63 ^ auVar36._8_4_);
            local_2660._12_4_ = (float)(uVar64 ^ auVar36._12_4_);
            fVar47 = *(float *)(ray + k * 4 + 0x60);
            auVar37._0_4_ = local_2650._0_4_ * fVar47;
            auVar37._4_4_ = local_2650._4_4_ * fVar47;
            auVar37._8_4_ = local_2650._8_4_ * fVar47;
            auVar37._12_4_ = local_2650._12_4_ * fVar47;
            auVar36 = vcmpps_avx(auVar37,local_2660,1);
            fVar47 = *(float *)(ray + k * 4 + 0x100);
            auVar46 = ZEXT1664(CONCAT412(fVar47,CONCAT48(fVar47,CONCAT44(fVar47,fVar47))));
            auVar45._0_4_ = fVar47 * local_2650._0_4_;
            auVar45._4_4_ = fVar47 * local_2650._4_4_;
            auVar45._8_4_ = fVar47 * local_2650._8_4_;
            auVar45._12_4_ = fVar47 * local_2650._12_4_;
            auVar40 = vcmpps_avx(local_2660,auVar45,2);
            auVar36 = vandps_avx(auVar36,auVar40);
            auVar40 = auVar29 & auVar36;
            if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              local_2760 = vandps_avx(auVar29,auVar36);
              local_2630 = local_2760;
              auVar29 = vrcpps_avx(local_2650);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = 0x3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_fma(local_2650,auVar29,auVar32);
              auVar29 = vfmadd132ps_fma(auVar36,auVar29,auVar29);
              fVar47 = auVar29._0_4_;
              local_2600._0_4_ = fVar47 * local_2660._0_4_;
              fVar52 = auVar29._4_4_;
              local_2600._4_4_ = fVar52 * local_2660._4_4_;
              fVar53 = auVar29._8_4_;
              local_2600._8_4_ = fVar53 * local_2660._8_4_;
              fVar54 = auVar29._12_4_;
              local_2600._12_4_ = fVar54 * local_2660._12_4_;
              auVar51 = ZEXT1664(local_2600);
              local_2620[0] = fVar47 * local_2680._0_4_;
              local_2620[1] = fVar52 * local_2680._4_4_;
              local_2620[2] = fVar53 * local_2680._8_4_;
              local_2620[3] = fVar54 * local_2680._12_4_;
              auVar33._8_4_ = 0x7f800000;
              auVar33._0_8_ = 0x7f8000007f800000;
              auVar33._12_4_ = 0x7f800000;
              auVar29 = vblendvps_avx(auVar33,local_2600,local_2760);
              local_2610[0] = fVar47 * local_2670._0_4_;
              local_2610[1] = fVar52 * local_2670._4_4_;
              local_2610[2] = fVar53 * local_2670._8_4_;
              local_2610[3] = fVar54 * local_2670._12_4_;
              auVar36 = vshufps_avx(auVar29,auVar29,0xb1);
              auVar36 = vminps_avx(auVar36,auVar29);
              auVar40 = vshufpd_avx(auVar36,auVar36,1);
              auVar36 = vminps_avx(auVar40,auVar36);
              auVar29 = vcmpps_avx(auVar29,auVar36,0);
              auVar40 = local_2760 & auVar29;
              auVar36 = vpcmpeqd_avx(auVar36,auVar36);
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar40[0xf] < '\0') {
                auVar36 = auVar29;
              }
              auVar29 = vandps_avx(local_2760,auVar36);
              uVar9 = vmovmskps_avx(auVar29);
              local_2728 = 0;
              for (uVar22 = CONCAT44((int)((ulong)lVar11 >> 0x20),uVar9); local_2748 = pSVar19,
                  (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                local_2728 = local_2728 + 1;
              }
              do {
                local_2740 = auVar46._0_16_;
                uVar13 = *(uint *)((long)&local_2690 + local_2728 * 4);
                uVar22 = (ulong)uVar13;
                local_2730 = (pSVar19->geometries).items[uVar22].ptr;
                if ((local_2730->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_2760 + local_2728 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2730->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar47 = local_2620[local_2728];
                    fVar52 = local_2610[local_2728];
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_2600 + local_2728 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) =
                         *(undefined4 *)(local_25f0 + local_2728 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) =
                         *(undefined4 *)(local_25e0 + local_2728 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) =
                         *(undefined4 *)(local_25d0 + local_2728 * 4);
                    *(float *)(ray + k * 4 + 0x1e0) = fVar47;
                    *(float *)(ray + k * 4 + 0x200) = fVar52;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_26d0 + local_2728 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar13;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_26a0 = auVar51._0_16_;
                  local_25c0 = auVar79._0_32_;
                  fVar47 = local_2620[local_2728];
                  local_2460._4_4_ = fVar47;
                  local_2460._0_4_ = fVar47;
                  local_2460._8_4_ = fVar47;
                  local_2460._12_4_ = fVar47;
                  local_2460._16_4_ = fVar47;
                  local_2460._20_4_ = fVar47;
                  local_2460._24_4_ = fVar47;
                  local_2460._28_4_ = fVar47;
                  local_2440 = local_2610[local_2728];
                  uVar9 = *(undefined4 *)((long)&local_26d0 + local_2728 * 4);
                  auVar41._4_4_ = uVar9;
                  auVar41._0_4_ = uVar9;
                  auVar41._8_4_ = uVar9;
                  auVar41._12_4_ = uVar9;
                  auVar42._16_4_ = uVar9;
                  auVar42._0_16_ = auVar41;
                  auVar42._20_4_ = uVar9;
                  auVar42._24_4_ = uVar9;
                  auVar42._28_4_ = uVar9;
                  local_24c0._4_4_ = *(undefined4 *)(local_25f0 + local_2728 * 4);
                  uVar9 = *(undefined4 *)(local_25e0 + local_2728 * 4);
                  local_24a0._4_4_ = uVar9;
                  local_24a0._0_4_ = uVar9;
                  local_24a0._8_4_ = uVar9;
                  local_24a0._12_4_ = uVar9;
                  local_24a0._16_4_ = uVar9;
                  local_24a0._20_4_ = uVar9;
                  local_24a0._24_4_ = uVar9;
                  local_24a0._28_4_ = uVar9;
                  uVar9 = *(undefined4 *)(local_25d0 + local_2728 * 4);
                  local_2480._4_4_ = uVar9;
                  local_2480._0_4_ = uVar9;
                  local_2480._8_4_ = uVar9;
                  local_2480._12_4_ = uVar9;
                  local_2480._16_4_ = uVar9;
                  local_2480._20_4_ = uVar9;
                  local_2480._24_4_ = uVar9;
                  local_2480._28_4_ = uVar9;
                  auVar38._4_4_ = uVar13;
                  auVar38._0_4_ = uVar13;
                  auVar38._8_4_ = uVar13;
                  auVar38._12_4_ = uVar13;
                  auVar39._16_4_ = uVar13;
                  auVar39._0_16_ = auVar38;
                  auVar39._20_4_ = uVar13;
                  auVar39._24_4_ = uVar13;
                  auVar39._28_4_ = uVar13;
                  local_24c0._0_4_ = local_24c0._4_4_;
                  local_24c0._8_4_ = local_24c0._4_4_;
                  local_24c0._12_4_ = local_24c0._4_4_;
                  local_24c0._16_4_ = local_24c0._4_4_;
                  local_24c0._20_4_ = local_24c0._4_4_;
                  local_24c0._24_4_ = local_24c0._4_4_;
                  local_24c0._28_4_ = local_24c0._4_4_;
                  fStack_243c = local_2440;
                  fStack_2438 = local_2440;
                  fStack_2434 = local_2440;
                  fStack_2430 = local_2440;
                  fStack_242c = local_2440;
                  fStack_2428 = local_2440;
                  fStack_2424 = local_2440;
                  local_2420 = auVar42;
                  local_2400 = auVar39;
                  vpcmpeqd_avx2(local_2460,local_2460);
                  uStack_23dc = context->user->instID[0];
                  local_23e0 = uStack_23dc;
                  uStack_23d8 = uStack_23dc;
                  uStack_23d4 = uStack_23dc;
                  uStack_23d0 = uStack_23dc;
                  uStack_23cc = uStack_23dc;
                  uStack_23c8 = uStack_23dc;
                  uStack_23c4 = uStack_23dc;
                  uStack_23bc = context->user->instPrimID[0];
                  local_23c0 = uStack_23bc;
                  uStack_23b8 = uStack_23bc;
                  uStack_23b4 = uStack_23bc;
                  uStack_23b0 = uStack_23bc;
                  uStack_23ac = uStack_23bc;
                  uStack_23a8 = uStack_23bc;
                  uStack_23a4 = uStack_23bc;
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_2600 + local_2728 * 4);
                  local_26c0 = local_25a0;
                  local_2700.valid = (int *)local_26c0;
                  local_2700.geometryUserPtr = local_2730->userPtr;
                  local_2700.context = context->user;
                  local_2700.hit = (RTCHitN *)local_24c0;
                  local_2700.N = 8;
                  local_2700.ray = (RTCRayN *)ray;
                  if (local_2730->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar39 = ZEXT1632(auVar38);
                    auVar42 = ZEXT1632(auVar41);
                    (*local_2730->intersectionFilterN)(&local_2700);
                  }
                  auVar50 = vpcmpeqd_avx2(local_26c0,_DAT_01faff00);
                  auVar35 = _DAT_01fe9960 & ~auVar50;
                  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar35 >> 0x7f,0) == '\0') &&
                        (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar35 >> 0xbf,0) == '\0') &&
                      (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar35[0x1f]) {
                    auVar50 = auVar50 ^ _DAT_01fe9960;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2730->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar39 = ZEXT1632(auVar39._0_16_);
                      auVar42 = ZEXT1632(auVar42._0_16_);
                      (*p_Var7)(&local_2700);
                    }
                    auVar56 = vpcmpeqd_avx2(local_26c0,_DAT_01faff00);
                    auVar35 = vpcmpeqd_avx2(auVar42,auVar42);
                    auVar50 = auVar56 ^ auVar35;
                    auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
                    auVar35 = auVar35 & ~auVar56;
                    if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar35 >> 0x7f,0) != '\0') ||
                          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar35 >> 0xbf,0) != '\0') ||
                        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar35[0x1f] < '\0') {
                      auVar56 = auVar56 ^ auVar39;
                      auVar35 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])local_2700.hit);
                      *(undefined1 (*) [32])(local_2700.ray + 0x180) = auVar35;
                      auVar35 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(local_2700.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_2700.ray + 0x1a0) = auVar35;
                      auVar35 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(local_2700.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_2700.ray + 0x1c0) = auVar35;
                      auVar35 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(local_2700.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_2700.ray + 0x1e0) = auVar35;
                      auVar35 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(local_2700.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_2700.ray + 0x200) = auVar35;
                      auVar35 = vpmaskmovd_avx2(auVar56,*(undefined1 (*) [32])
                                                         (local_2700.hit + 0xa0));
                      *(undefined1 (*) [32])(local_2700.ray + 0x220) = auVar35;
                      auVar35 = vpmaskmovd_avx2(auVar56,*(undefined1 (*) [32])
                                                         (local_2700.hit + 0xc0));
                      *(undefined1 (*) [32])(local_2700.ray + 0x240) = auVar35;
                      auVar35 = vpmaskmovd_avx2(auVar56,*(undefined1 (*) [32])
                                                         (local_2700.hit + 0xe0));
                      *(undefined1 (*) [32])(local_2700.ray + 0x260) = auVar35;
                      auVar35 = vpmaskmovd_avx2(auVar56,*(undefined1 (*) [32])
                                                         (local_2700.hit + 0x100));
                      *(undefined1 (*) [32])(local_2700.ray + 0x280) = auVar35;
                    }
                  }
                  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar50 >> 0x7f,0) == '\0') &&
                        (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar50 >> 0xbf,0) == '\0') &&
                      (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar50[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_2740._0_4_;
                  }
                  else {
                    local_2740 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_2760 + local_2728 * 4) = 0;
                  auVar46 = ZEXT1664(local_2740);
                  uVar9 = local_2740._0_4_;
                  auVar27._4_4_ = uVar9;
                  auVar27._0_4_ = uVar9;
                  auVar27._8_4_ = uVar9;
                  auVar27._12_4_ = uVar9;
                  auVar51 = ZEXT1664(local_26a0);
                  auVar29 = vcmpps_avx(local_26a0,auVar27,2);
                  local_2760 = vandps_avx(auVar29,local_2760);
                  auVar79 = ZEXT3264(local_25c0);
                  uVar22 = local_2728;
                  pSVar19 = local_2748;
                }
                if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2760[0xf]) break;
                auVar34._8_4_ = 0x7f800000;
                auVar34._0_8_ = 0x7f8000007f800000;
                auVar34._12_4_ = 0x7f800000;
                auVar29 = vblendvps_avx(auVar34,auVar51._0_16_,local_2760);
                auVar36 = vshufps_avx(auVar29,auVar29,0xb1);
                auVar36 = vminps_avx(auVar36,auVar29);
                auVar40 = vshufpd_avx(auVar36,auVar36,1);
                auVar36 = vminps_avx(auVar40,auVar36);
                auVar36 = vcmpps_avx(auVar29,auVar36,0);
                auVar40 = local_2760 & auVar36;
                auVar29 = local_2760;
                if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar40[0xf] < '\0') {
                  auVar29 = vandps_avx(auVar36,local_2760);
                }
                uVar9 = vmovmskps_avx(auVar29);
                local_2728 = 0;
                for (uVar22 = CONCAT44((int)(uVar22 >> 0x20),uVar9); (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  local_2728 = local_2728 + 1;
                }
              } while( true );
            }
          }
          local_2720 = local_2720 + 1;
        } while (local_2720 != local_2718);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar28 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(
                                                  uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
      auVar46 = ZEXT3264(local_24e0);
      auVar51 = ZEXT3264(local_2500);
      auVar57 = ZEXT3264(local_2520);
      auVar61 = ZEXT3264(local_2540);
      auVar66 = ZEXT3264(local_2560);
      auVar70 = ZEXT3264(local_2580);
    }
    if (pauVar10 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }